

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie_tree.cpp
# Opt level: O0

void __thiscall la::trie_tree::insert(trie_tree *this,string *key)

{
  size_t sVar1;
  size_type sVar2;
  reference pvVar3;
  reference pptVar4;
  trie_node *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  size_t local_30;
  size_t ci;
  size_type i;
  trie_node *cur_node;
  string *key_local;
  trie_tree *this_local;
  
  i = (size_type)this->_root_node;
  ci = 0;
  cur_node = (trie_node *)key;
  key_local = (string *)this;
  while( true ) {
    sVar1 = ci;
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)cur_node
                      );
    if (sVar2 <= sVar1) break;
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        cur_node,ci);
    local_30 = trie_node::convertIndex(pvVar3);
    pptVar4 = std::array<la::trie_node_*,_40UL>::operator[]
                        ((array<la::trie_node_*,_40UL> *)i,local_30);
    if (*pptVar4 == (value_type)0x0) {
      this_00 = (trie_node *)operator_new(0x168);
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          cur_node,ci);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)cur_node,0,
                 ci + 1);
      trie_node::trie_node(this_00,pvVar3,&local_60);
      pptVar4 = std::array<la::trie_node_*,_40UL>::operator[]
                          ((array<la::trie_node_*,_40UL> *)i,local_30);
      *pptVar4 = this_00;
      std::__cxx11::string::~string((string *)&local_60);
    }
    pptVar4 = std::array<la::trie_node_*,_40UL>::operator[]
                        ((array<la::trie_node_*,_40UL> *)i,local_30);
    i = (size_type)*pptVar4;
    ci = ci + 1;
  }
  *(undefined1 *)(i + 0x140) = 1;
  return;
}

Assistant:

void trie_tree::insert(std::string &&key)
    {
        auto cur_node{_root_node};
        for (decltype(key.size()) i{0}; i < key.size(); ++i)
        {
            const auto ci{trie_node::convertIndex(key[i])};
            if (cur_node->_children[ci] == nullptr)
                cur_node->_children[ci] = new trie_node{key[i], key.substr(0, i + 1)};
            cur_node = cur_node->_children[ci];
        }
        cur_node->_is_end_word = true;
    }